

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_fcmlas_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  float32 fVar4;
  float32 fVar5;
  ulong opr_sz_00;
  ulong uVar6;
  uintptr_t max_sz;
  float32 e3;
  float32 e4;
  float32 e1;
  float32 e2;
  uintptr_t i;
  uint32_t neg_real;
  uint32_t neg_imag;
  intptr_t flip;
  float_status *fpst;
  float32 *m;
  float32 *n;
  float32 *d;
  uintptr_t opr_sz;
  uint32_t desc_local;
  void *vfpst_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  uVar2 = extract32(desc,10,1);
  uVar6 = (ulong)uVar2;
  uVar3 = extract32(desc,0xb,1);
  for (_e1 = 0; _e1 < opr_sz_00 >> 2; _e1 = _e1 + 2) {
    fVar5 = *(float32 *)((long)vn + (_e1 + uVar6) * 4);
    uVar1 = *(uint *)((long)vm + ((_e1 + 1) - uVar6) * 4);
    fVar4 = float32_muladd_arm(fVar5,*(uint *)((long)vm + (_e1 + uVar6) * 4) ^
                                     (uVar2 ^ uVar3) << 0x1f,*(float32 *)((long)vd + _e1 * 4),0,
                               (float_status *)vfpst);
    *(float32 *)((long)vd + _e1 * 4) = fVar4;
    fVar5 = float32_muladd_arm(fVar5,uVar1 ^ uVar3 << 0x1f,*(float32 *)((long)vd + _e1 * 4 + 4),0,
                               (float_status *)vfpst);
    *(float32 *)((long)vd + _e1 * 4 + 4) = fVar5;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_fcmlas)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float32 *d = vd;
    float32 *n = vn;
    float32 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    uint32_t neg_real = flip ^ neg_imag;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 31;
    neg_imag <<= 31;

    for (i = 0; i < opr_sz / 4; i += 2) {
        float32 e2 = n[H4(i + flip)];
        float32 e1 = m[H4(i + flip)] ^ neg_real;
        float32 e4 = e2;
        float32 e3 = m[H4(i + 1 - flip)] ^ neg_imag;

        d[H4(i)] = float32_muladd(e2, e1, d[H4(i)], 0, fpst);
        d[H4(i + 1)] = float32_muladd(e4, e3, d[H4(i + 1)], 0, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}